

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ExtensionSet::UnsafeArenaSetAllocatedMessage
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor,
          MessageLite *message)

{
  byte bVar1;
  LogMessage *pLVar2;
  Extension *pEVar3;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar4;
  LogMessage local_e0;
  LogMessage local_a8;
  LogMessage local_70;
  LogFinisher local_31;
  
  if (message == (MessageLite *)0x0) {
    pEVar3 = FindOrNull(this,number);
    if (pEVar3 == (Extension *)0x0) {
      return;
    }
    Extension::Clear(pEVar3);
    return;
  }
  pVar4 = Insert(this,number);
  pEVar3 = pVar4.first;
  pEVar3->descriptor = descriptor;
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar3->is_repeated != false) {
      LogMessage::LogMessage
                (&local_a8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/extension_set.cc"
                 ,0x2a9);
      pLVar2 = LogMessage::operator<<
                         (&local_a8,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD) == (OPTIONAL_FIELD): "
                         );
      LogFinisher::operator=((LogFinisher *)&local_70,pLVar2);
      LogMessage::~LogMessage(&local_a8);
    }
    bVar1 = pEVar3->type;
    if ((byte)(bVar1 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/extension_set.cc"
                 ,0x3c);
      pLVar2 = LogMessage::operator<<
                         (&local_70,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=((LogFinisher *)&local_e0,pLVar2);
      LogMessage::~LogMessage(&local_70);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) != 10) {
      LogMessage::LogMessage
                (&local_e0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/extension_set.cc"
                 ,0x2a9);
      pLVar2 = LogMessage::operator<<
                         (&local_e0,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_31,pLVar2);
      LogMessage::~LogMessage(&local_e0);
    }
    if ((pEVar3->field_0xa & 0x10) != 0) {
      (*(code *)(((((pEVar3->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).arena_)->
                impl_).options_.max_block_size)((pEVar3->field_0).repeated_string_value,message);
      goto LAB_00216366;
    }
    if ((this->arena_ == (Arena *)0x0) &&
       ((pEVar3->field_0).repeated_string_value !=
        (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)0x0)) {
      (*(code *)(((((pEVar3->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).arena_)->
                impl_).hint_._M_b._M_p)();
    }
  }
  else {
    pEVar3->type = type;
    if ((byte)(type - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/extension_set.cc"
                 ,0x3c);
      pLVar2 = LogMessage::operator<<
                         (&local_70,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=((LogFinisher *)&local_a8,pLVar2);
      LogMessage::~LogMessage(&local_70);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4) != 10) {
      LogMessage::LogMessage
                (&local_a8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/extension_set.cc"
                 ,0x2a4);
      pLVar2 = LogMessage::operator<<
                         (&local_a8,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=((LogFinisher *)&local_e0,pLVar2);
      LogMessage::~LogMessage(&local_a8);
    }
    pEVar3->is_repeated = false;
    pEVar3->field_0xa = pEVar3->field_0xa & 0xf;
  }
  (pEVar3->field_0).message_value = message;
LAB_00216366:
  pEVar3->field_0xa = pEVar3->field_0xa & 0xf0;
  return;
}

Assistant:

void ExtensionSet::UnsafeArenaSetAllocatedMessage(
    int number, FieldType type, const FieldDescriptor* descriptor,
    MessageLite* message) {
  if (message == NULL) {
    ClearExtension(number);
    return;
  }
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_lazy = false;
    extension->message_value = message;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    if (extension->is_lazy) {
      extension->lazymessage_value->UnsafeArenaSetAllocatedMessage(message);
    } else {
      if (arena_ == NULL) {
        delete extension->message_value;
      }
      extension->message_value = message;
    }
  }
  extension->is_cleared = false;
}